

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Routing.cpp
# Opt level: O0

int Routing::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  ulong uVar1;
  UnityAudioParameterDefinition *pUVar2;
  int local_18;
  int i;
  int numparams;
  UnityAudioEffectDefinition *definition_local;
  
  uVar1 = SUB168(ZEXT816(1) * ZEXT816(0x40),0);
  if (SUB168(ZEXT816(1) * ZEXT816(0x40),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(uVar1);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"Target","",0.0,15.0,0.0,1.0,1.0,0,
                    "Specifies the output that the input signal is routed to. This can be read by scripts via RoutingDemo_GetData"
                   );
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    RingBuffer<65536,_float>::Clear((RingBuffer<65536,_float> *)(buffer + (long)local_18 * 0x40008))
    ;
  }
  return 1;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Target", "", 0.0f, MAXINDEX - 1, 0.0f, 1.0f, 1.0f, P_TARGET, "Specifies the output that the input signal is routed to. This can be read by scripts via RoutingDemo_GetData");
        for (int i = 0; i < MAXINDEX; i++)
            buffer[i].Clear();
        return numparams;
    }